

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall
icu_63::MessagePattern::parsePluralOrSelectStyle
          (MessagePattern *this,UMessagePatternArgType argType,int32_t index,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  UnicodeString *this_00;
  short sVar1;
  bool bVar2;
  int8_t iVar3;
  char16_t cVar4;
  int32_t offset;
  int32_t iVar5;
  int iVar6;
  UErrorCode UVar7;
  int iVar8;
  int32_t iVar9;
  bool bVar10;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = &this->msg;
    bVar2 = false;
    bVar10 = false;
    iVar5 = index;
    do {
      offset = skipWhiteSpace(this,iVar5);
      sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->msg).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      iVar9 = index;
      if ((offset == iVar5) || (cVar4 = UnicodeString::doCharAt(this_00,offset), cVar4 == L'}')) {
        bVar10 = true;
        if (nestingLevel < 1) {
          bVar10 = ((this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.
                   ptr)->type == UMSGPAT_PART_TYPE_MSG_START;
        }
        UVar7 = U_PATTERN_SYNTAX_ERROR;
        if (bVar10 != (offset == iVar5)) {
          if (bVar2) {
            return offset;
          }
          UVar7 = U_DEFAULT_KEYWORD_MISSING;
          iVar9 = 0;
        }
        goto LAB_0027b09a;
      }
      if (((argType == UMSGPAT_ARG_TYPE_SELECTORDINAL) || (argType == UMSGPAT_ARG_TYPE_PLURAL)) &&
         (cVar4 = UnicodeString::doCharAt(this_00,offset), cVar4 == L'=')) {
        iVar5 = skipDouble(this,offset + 1);
        iVar8 = iVar5 - offset;
        if (iVar8 == 1) goto LAB_0027b095;
        if (0xffff < iVar8) {
LAB_0027b089:
          UVar7 = U_INDEX_OUTOFBOUNDS_ERROR;
          iVar9 = offset;
          goto LAB_0027b09a;
        }
        addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,offset,iVar8,0,errorCode);
        parseDouble(this,offset + 1,iVar5,'\0',parseError,errorCode);
LAB_0027af6a:
        if (U_ZERO_ERROR < *errorCode) {
          return 0;
        }
        iVar5 = skipWhiteSpace(this,iVar5);
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar8 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          iVar8 = (int)sVar1 >> 5;
        }
        UVar7 = U_PATTERN_SYNTAX_ERROR;
        iVar9 = offset;
        if ((iVar5 == iVar8) || (cVar4 = UnicodeString::doCharAt(this_00,iVar5), cVar4 != L'{')) {
LAB_0027b09a:
          setParseError(this,parseError,iVar9);
          *errorCode = UVar7;
          return 0;
        }
        iVar5 = parseMessage(this,iVar5,1,nestingLevel + 1,argType,parseError,errorCode);
      }
      else {
        iVar5 = skipIdentifier(this,offset);
        iVar8 = iVar5 - offset;
        if (iVar8 == 0) goto LAB_0027b095;
        if (iVar8 != 6 || (argType - UMSGPAT_ARG_TYPE_PLURAL & 0xfffffffd) != 0) {
          if (0xffff < iVar8) goto LAB_0027b089;
LAB_0027af1f:
          addPart(this,UMSGPAT_PART_TYPE_ARG_SELECTOR,offset,iVar8,0,errorCode);
          iVar3 = UnicodeString::doCompare(this_00,offset,iVar8,(UChar *)kOther,0,5);
          if (iVar3 == '\0') {
            bVar2 = true;
          }
          goto LAB_0027af6a;
        }
        sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (this->msg).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        if ((iVar6 <= iVar5) ||
           (iVar3 = UnicodeString::doCompare(this_00,offset,7,(UChar *)kOffsetColon,0,7),
           iVar3 != '\0')) goto LAB_0027af1f;
        if (bVar10) {
LAB_0027b095:
          UVar7 = U_PATTERN_SYNTAX_ERROR;
          goto LAB_0027b09a;
        }
        offset = skipWhiteSpace(this,iVar5 + 1);
        iVar5 = skipDouble(this,offset);
        if (iVar5 == offset) goto LAB_0027b095;
        if (0xffff < iVar5 - offset) goto LAB_0027b089;
        parseDouble(this,offset,iVar5,'\0',parseError,errorCode);
      }
      bVar10 = true;
    } while (*errorCode < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return 0;
}

Assistant:

int32_t
MessagePattern::parsePluralOrSelectStyle(UMessagePatternArgType argType,
                                         int32_t index, int32_t nestingLevel,
                                         UParseError *parseError, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t start=index;
    UBool isEmpty=TRUE;
    UBool hasOther=FALSE;
    for(;;) {
        // First, collect the selector looking for a small set of terminators.
        // It would be a little faster to consider the syntax of each possible
        // token right here, but that makes the code too complicated.
        index=skipWhiteSpace(index);
        UBool eos=index==msg.length();
        if(eos || msg.charAt(index)==u_rightCurlyBrace) {
            if(eos==inMessageFormatPattern(nestingLevel)) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(!hasOther) {
                setParseError(parseError, 0);  // Missing 'other' keyword in plural/select pattern.
                errorCode=U_DEFAULT_KEYWORD_MISSING;
                return 0;
            }
            return index;
        }
        int32_t selectorIndex=index;
        if(UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && msg.charAt(selectorIndex)==u_equal) {
            // explicit-value plural selector: =double
            index=skipDouble(index+1);
            int32_t length=index-selectorIndex;
            if(length==1) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            if(length>Part::MAX_LENGTH) {
                setParseError(parseError, selectorIndex);  // Argument selector too long.
                errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
            parseDouble(selectorIndex+1, index, FALSE,
                        parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
        } else {
            index=skipIdentifier(index);
            int32_t length=index-selectorIndex;
            if(length==0) {
                setParseError(parseError, start);  // Bad plural/select pattern syntax.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
            // Note: The ':' in "offset:" is just beyond the skipIdentifier() range.
            if( UMSGPAT_ARG_TYPE_HAS_PLURAL_STYLE(argType) && length==6 && index<msg.length() &&
                0==msg.compare(selectorIndex, 7, kOffsetColon, 0, 7)
            ) {
                // plural offset, not a selector
                if(!isEmpty) {
                    // Plural argument 'offset:' (if present) must precede key-message pairs.
                    setParseError(parseError, start);
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                // allow whitespace between offset: and its value
                int32_t valueIndex=skipWhiteSpace(index+1);  // The ':' is at index.
                index=skipDouble(valueIndex);
                if(index==valueIndex) {
                    setParseError(parseError, start);  // Missing value for plural 'offset:'.
                    errorCode=U_PATTERN_SYNTAX_ERROR;
                    return 0;
                }
                if((index-valueIndex)>Part::MAX_LENGTH) {
                    setParseError(parseError, valueIndex);  // Plural offset value too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                parseDouble(valueIndex, index, FALSE,
                            parseError, errorCode);  // adds ARG_INT or ARG_DOUBLE
                if(U_FAILURE(errorCode)) {
                    return 0;
                }
                isEmpty=FALSE;
                continue;  // no message fragment after the offset
            } else {
                // normal selector word
                if(length>Part::MAX_LENGTH) {
                    setParseError(parseError, selectorIndex);  // Argument selector too long.
                    errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                    return 0;
                }
                addPart(UMSGPAT_PART_TYPE_ARG_SELECTOR, selectorIndex, length, 0, errorCode);
                if(0==msg.compare(selectorIndex, length, kOther, 0, 5)) {
                    hasOther=TRUE;
                }
            }
        }
        if(U_FAILURE(errorCode)) {
            return 0;
        }

        // parse the message fragment following the selector
        index=skipWhiteSpace(index);
        if(index==msg.length() || msg.charAt(index)!=u_leftCurlyBrace) {
            setParseError(parseError, selectorIndex);  // No message fragment after plural/select selector.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        index=parseMessage(index, 1, nestingLevel+1, argType, parseError, errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        isEmpty=FALSE;
    }
}